

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_list.cpp
# Opt level: O3

void __thiscall ImageList::drawRow(ImageList *this,QPainter *painter,QRect *rect,int row)

{
  int iVar1;
  int iVar2;
  AbstractScrollArea *pAVar3;
  char cVar4;
  ColorGroup CVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  int iVar10;
  int iVar11;
  QColor QVar12;
  QRect r;
  QColor background;
  QColor border;
  QLinearGradient g;
  QPointF local_d8;
  QRect *local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  QColor local_a8;
  QPointF local_98;
  QColor local_88 [5];
  
  CVar5 = QWidget::palette();
  plVar9 = (long *)QPalette::brush(CVar5,Dark);
  local_a8._0_8_ = *(undefined8 *)(*plVar9 + 8);
  local_a8._8_8_ = *(undefined8 *)(*plVar9 + 0x10);
  local_d8.xp = 0.0;
  local_d8.yp = 0.0;
  local_98.xp = 1.0;
  local_98.yp = 0.0;
  QLinearGradient::QLinearGradient((QLinearGradient *)local_88,&local_d8,&local_98);
  QGradient::setCoordinateMode((CoordinateMode)local_88);
  QGradient::setColorAt(0.0,local_88);
  QVar12 = QtMWidgets::lighterColor(&local_a8,0x4b);
  local_d8.xp = QVar12._0_8_;
  local_d8.yp._0_6_ = QVar12.ct._4_6_;
  QGradient::setColorAt(1.0,local_88);
  CVar5 = QWidget::palette();
  plVar9 = (long *)QPalette::brush(CVar5,Dark);
  local_98.xp = *(qreal *)(*plVar9 + 8);
  local_98.yp = *(qreal *)(*plVar9 + 0x10);
  QPainter::setPen((QColor *)painter);
  QBrush::QBrush((QBrush *)&local_d8,(QGradient *)local_88);
  QPainter::setBrush((QBrush *)painter);
  QBrush::~QBrush((QBrush *)&local_d8);
  pAVar3 = (this->super_AbstractListView<QImage>).super_AbstractListViewBase.
           super_AbstractScrollArea.d.d[1].q;
  (**(code **)(*(long *)pAVar3 + 0x60))(pAVar3,row);
  iVar10 = rect->x1;
  iVar11 = rect->x2;
  local_c0 = (QRect *)painter;
  iVar6 = QImage::width();
  iVar1 = rect->y1;
  iVar7 = QImage::width();
  iVar2 = ((this->d).d)->borderWidth;
  iVar8 = QImage::height();
  iVar11 = iVar11 - (iVar6 + iVar10);
  iVar10 = ((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1) + iVar10;
  local_b0 = iVar7 + iVar10 + iVar2 * 2 + -1;
  local_ac = iVar8 + iVar1 + ((this->d).d)->borderWidth * 2 + -1;
  local_b8 = iVar10;
  local_b4 = iVar1;
  QPainter::drawRects(local_c0,(int)&local_b8);
  iVar11 = ((this->d).d)->borderWidth;
  local_d8.xp = (qreal)CONCAT44(iVar11 + -1 + local_b4,local_b8 + iVar11 + -1);
  local_d8.yp = (qreal)CONCAT44(local_ac - iVar11,local_b0 - iVar11);
  QPainter::drawRects(local_c0,(int)&local_d8);
  cVar4 = QImage::isNull();
  if (cVar4 == '\0') {
    iVar11 = ((this->d).d)->borderWidth;
    local_d8.xp = (qreal)(iVar10 + iVar11);
    local_d8.yp = (qreal)(iVar1 + iVar11);
    QPainter::drawImage((QPointF *)local_c0,(QImage *)&local_d8);
  }
  QLinearGradient::~QLinearGradient((QLinearGradient *)local_88);
  return;
}

Assistant:

void
ImageList::drawRow( QPainter * painter,
	const QRect & rect, int row )
{
	QColor background = palette().color( QPalette::Button );

	QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 1.0, 0.0 ) );
	g.setCoordinateMode( QGradient::ObjectBoundingMode );
	g.setColorAt( 0.0, background );
	g.setColorAt( 1.0, QtMWidgets::lighterColor( background, 75 ) );

	QColor border = palette().color( QPalette::Dark );

	painter->setPen( border );
	painter->setBrush( g );

	const QImage & image = model()->data( row );

	const int x = rect.x() + ( rect.width() - image.width() ) / 2;
	const int y = rect.y();

	const QRect r( x, y,
		image.width() + 2 * d->borderWidth,
		image.height() + 2 * d->borderWidth );

	painter->drawRect( r );
	painter->drawRect( r.adjusted( d->borderWidth - 1, d->borderWidth - 1,
		- d->borderWidth, - d->borderWidth ) );

	if( !image.isNull() )
		painter->drawImage( QPoint( x + d->borderWidth, y + d->borderWidth ),
			image );
}